

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGen::Tools_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,bool moc,bool uic,bool rcc)

{
  string_view view;
  string_view view_00;
  size_type sVar1;
  reference pvVar2;
  reference args_2;
  cmAlphaNum local_178;
  size_t local_148;
  char *local_140;
  cmAlphaNum local_138;
  cmAlphaNum local_108;
  size_t local_d8;
  char *local_d0;
  cmAlphaNum local_c8;
  allocator<char> local_81;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  size_type local_50;
  size_type num;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> lst;
  bool rcc_local;
  bool uic_local;
  bool moc_local;
  
  lst._M_elems[2]._M_str._7_1_ = (byte)this & 1;
  lst._M_elems[2]._M_str._5_1_ = uic;
  lst._M_elems[2]._M_str._6_1_ = moc;
  std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::array
            ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)&num);
  local_50 = 0;
  if ((lst._M_elems[2]._M_str._7_1_ & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"AUTOMOC");
    sVar1 = local_50;
    local_50 = local_50 + 1;
    pvVar2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::at
                       ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)&num,
                        sVar1);
    pvVar2->_M_len = local_60._M_len;
    pvVar2->_M_str = local_60._M_str;
  }
  if ((lst._M_elems[2]._M_str._6_1_ & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"AUTOUIC");
    sVar1 = local_50;
    local_50 = local_50 + 1;
    pvVar2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::at
                       ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)&num,
                        sVar1);
    pvVar2->_M_len = local_70._M_len;
    pvVar2->_M_str = local_70._M_str;
  }
  if ((lst._M_elems[2]._M_str._5_1_ & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,"AUTORCC");
    sVar1 = local_50;
    local_50 = local_50 + 1;
    pvVar2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::at
                       ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)&num,
                        sVar1);
    pvVar2->_M_len = local_80._M_len;
    pvVar2->_M_str = local_80._M_str;
  }
  if (local_50 == 1) {
    pvVar2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::operator[]
                       ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)&num,0)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,pvVar2,&local_81);
    std::allocator<char>::~allocator(&local_81);
  }
  else if (local_50 == 2) {
    pvVar2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::operator[]
                       ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)&num,0)
    ;
    local_d8 = pvVar2->_M_len;
    local_d0 = pvVar2->_M_str;
    view._M_len = pvVar2->_M_len;
    view._M_str = pvVar2->_M_str;
    cmAlphaNum::cmAlphaNum(&local_c8,view);
    cmAlphaNum::cmAlphaNum(&local_108," and ");
    pvVar2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::operator[]
                       ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)&num,1)
    ;
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>>
              (__return_storage_ptr__,&local_c8,&local_108,pvVar2);
  }
  else if (local_50 == 3) {
    pvVar2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::operator[]
                       ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)&num,0)
    ;
    local_148 = pvVar2->_M_len;
    local_140 = pvVar2->_M_str;
    view_00._M_len = pvVar2->_M_len;
    view_00._M_str = pvVar2->_M_str;
    cmAlphaNum::cmAlphaNum(&local_138,view_00);
    cmAlphaNum::cmAlphaNum(&local_178,", ");
    pvVar2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::operator[]
                       ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)&num,1)
    ;
    args_2 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::operator[]
                       ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)&num,2)
    ;
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>,char[6],std::basic_string_view<char,std::char_traits<char>>>
              (__return_storage_ptr__,&local_138,&local_178,pvVar2,(char (*) [6])0xdb871f,args_2);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::Tools(bool moc, bool uic, bool rcc)
{
  std::array<cm::string_view, 3> lst;
  decltype(lst)::size_type num = 0;
  if (moc) {
    lst.at(num++) = "AUTOMOC";
  }
  if (uic) {
    lst.at(num++) = "AUTOUIC";
  }
  if (rcc) {
    lst.at(num++) = "AUTORCC";
  }
  switch (num) {
    case 1:
      return std::string(lst[0]);
    case 2:
      return cmStrCat(lst[0], " and ", lst[1]);
    case 3:
      return cmStrCat(lst[0], ", ", lst[1], " and ", lst[2]);
    default:
      break;
  }
  return std::string();
}